

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O2

void __thiscall merkle_tests::merkle_test::test_method(merkle_test *this)

{
  uchar *puVar1;
  long lVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  check_type cVar9;
  int iVar10;
  uint uVar11;
  check_type cVar12;
  check_type cVar13;
  size_t s;
  long lVar14;
  check_type cVar32;
  check_type cVar33;
  check_type i;
  int iVar15;
  long lVar16;
  pointer psVar17;
  pointer puVar18;
  uint uVar19;
  uint256 *puVar20;
  check_type cVar21;
  CMutableTransaction *__x;
  uint256 *puVar22;
  FastRandomContext *this_00;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var23;
  iterator in_R8;
  iterator pvVar24;
  iterator in_R9;
  iterator pvVar25;
  ulong uVar26;
  check_type cVar34;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  pointer puVar30;
  CMutableTransaction *a;
  long in_FS_OFFSET;
  bool bVar31;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  char *local_738;
  char *local_730;
  undefined1 local_728 [32];
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  vector<uint256,_std::allocator<uint256>_> newBranch;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  bool newMutated;
  vector<uint256,_std::allocator<uint256>_> merkleTree;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  bool unmutatedMutated;
  undefined1 local_568 [32];
  uint256 newRoot;
  uint256 oldRoot;
  uint256 unmutatedRoot;
  CBlock block;
  vector<uint256,_std::allocator<uint256>_> oldBranch;
  undefined8 uStack_460;
  uint256 h;
  CMutableTransaction mtx;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng;
  cVar13 = CHECK_PRED;
  do {
    if (cVar13 == 0x20) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    i = cVar13;
    if (0x10 < cVar13) {
      iVar8 = RandomMixin<FastRandomContext>::randrange<int>
                        (&this_00->super_RandomMixin<FastRandomContext>,4000);
      i = iVar8 + 0x11;
    }
    cVar9 = 0x10;
    if ((int)i < 0x10) {
      cVar9 = i;
    }
    iVar8 = 0;
    _cVar32 = CHECK_PRED;
    if (0 < (int)i) {
      _cVar32 = (check_type)(ulong)i;
    }
    if ((int)cVar9 < 1) {
      cVar9 = CHECK_PRED;
    }
    lVar14 = (long)(int)i << 4;
    for (; iVar8 != 4; iVar8 = iVar8 + 1) {
      if (iVar8 == 0) {
        if ((int)i < 1) break;
        uVar26 = 0;
        uVar19 = 0;
        _cVar33 = (check_type)(ulong)i;
        cVar21 = i;
LAB_0038405a:
        uVar28 = 0;
      }
      else {
        iVar10 = ctz(i);
        uVar19 = 1 << ((byte)iVar10 & 0x1f);
        uVar26 = (ulong)uVar19;
        if ((int)i <= (int)uVar19) break;
        cVar21 = i + uVar19;
        if (iVar8 == 1) {
          if (0 < (int)cVar21) {
            uVar19 = 0;
            _cVar33 = (check_type)(ulong)cVar21;
            goto LAB_0038405a;
          }
          break;
        }
        iVar10 = ctz(cVar21);
        uVar19 = 1 << ((byte)iVar10 & 0x1f);
        if ((int)cVar21 <= (int)uVar19) break;
        _cVar33 = (check_type)(ulong)(uVar19 + cVar21);
        if (iVar8 != 3) goto LAB_0038405a;
        iVar10 = ctz(uVar19 + cVar21);
        uVar28 = (ulong)(uint)(1 << ((byte)iVar10 & 0x1f));
      }
      iVar10 = (int)uVar28;
      if ((int)(check_type)_cVar33 <= iVar10) break;
      CBlock::CBlock(&block);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize(&block.vtx,(long)(int)i);
      cVar12 = (check_type)_cVar33;
      lVar16 = 0;
      for (_cVar34 = CHECK_PRED; _cVar32 != _cVar34; _cVar34 = (check_type)((long)_cVar34 + 1)) {
        CMutableTransaction::CMutableTransaction(&mtx);
        mtx.nLockTime = (uint32_t)_cVar34;
        std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&h);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((block.vtx.
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar16),
                   (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&h);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (h.super_base_blob<256U>.m_data._M_elems + 8));
        CMutableTransaction::~CMutableTransaction(&mtx);
        lVar16 = lVar16 + 0x10;
      }
      unmutatedMutated = false;
      BlockMerkleRoot(&unmutatedRoot,&block,&unmutatedMutated);
      local_580 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_578 = "";
      local_590 = &boost::unit_test::basic_cstring<char_const>::null;
      local_588 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0xd2;
      file.m_begin = (iterator)&local_580;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_590,msg)
      ;
      h.super_base_blob<256U>.m_data._M_elems._0_8_ =
           CONCAT71(h.super_base_blob<256U>.m_data._M_elems._1_7_,unmutatedMutated) ^ 1;
      h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_87c747;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbb3f3d;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&oldBranch;
      local_5a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_598 = "";
      pvVar24 = &DAT_00000001;
      pvVar25 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_5a0,
                 0xd2);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize(&block.vtx,(long)(int)(cVar12 + iVar10));
      lVar16 = lVar14;
      uVar27 = 0;
      if (0 < (int)uVar26) {
        uVar27 = uVar26;
      }
      while (uVar27 != 0) {
        p_Var23 = (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  + lVar16);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var23,p_Var23 + -(long)(int)uVar26);
        lVar16 = lVar16 + 0x10;
        uVar27 = uVar27 - 1;
      }
      uVar26 = 0;
      if (0 < (int)uVar19) {
        uVar26 = (ulong)uVar19;
      }
      lVar16 = (long)(int)cVar21 << 4;
      while (bVar31 = uVar26 != 0, uVar26 = uVar26 - 1, bVar31) {
        p_Var23 = (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  + lVar16);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var23,p_Var23 + -(long)(int)uVar19);
        lVar16 = lVar16 + 0x10;
      }
      if (iVar10 < 1) {
        uVar28 = 0;
      }
      lVar16 = (long)(int)(check_type)_cVar33 << 4;
      while (bVar31 = uVar28 != 0, uVar28 = uVar28 - 1, bVar31) {
        p_Var23 = (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  + lVar16);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var23,p_Var23 + -(long)iVar10);
        lVar16 = lVar16 + 0x10;
      }
      merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::reserve
                (&merkleTree,
                 ((long)block.vtx.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)block.vtx.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 0x10);
      lVar16 = -(long)block.vtx.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      for (psVar17 = block.vtx.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          psVar17 !=
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; psVar17 = psVar17 + 1) {
        std::vector<uint256,_std::allocator<uint256>_>::push_back
                  (&merkleTree,
                   &(((psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
        lVar16 = lVar16 + -0x10;
      }
      bVar31 = false;
      _cVar33 = (check_type)((ulong)_cVar33 & 0xffffffff00000000);
      uVar26 = (ulong)-((long)&((block.vtx.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar16) >> 4;
      while (iVar10 = (int)uVar26, 1 < iVar10) {
        uVar19 = iVar10 - 1;
        lVar16 = ((ulong)_cVar33 & 0xffffffff) << 5;
        for (uVar28 = 0; cVar33 = (check_type)_cVar33, uVar28 < (uVar26 & 0xffffffff);
            uVar28 = uVar28 + 2) {
          uVar11 = (int)uVar28 + 1;
          if ((int)uVar19 < (int)uVar11) {
            uVar11 = uVar19;
          }
          if (uVar28 < uVar19 && uVar11 + 1 == iVar10) {
            lVar29 = (long)(int)(uVar11 + cVar33);
            bVar7 = ::operator==((base_blob<256U> *)
                                 (((merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_base_blob<256U>).m_data._M_elems + lVar16),
                                 &merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar29].
                                  super_base_blob<256U>);
            if (bVar7) {
              bVar31 = true;
            }
          }
          else {
            lVar29 = (long)(int)(uVar11 + cVar33);
          }
          Hash<uint256,uint256>
                    ((uint256 *)&mtx,
                     (uint256 *)
                     (((merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar16),merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar29);
          std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                    (&merkleTree,(uint256 *)&mtx);
          lVar16 = lVar16 + 0x40;
        }
        _cVar33 = CONCAT44((int)((ulong)_cVar33 >> 0x20),cVar33 + iVar10);
        uVar26 = (ulong)(iVar10 + 1U >> 1);
      }
      if (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start ==
          merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        oldRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        oldRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      }
      else {
        oldRoot.super_base_blob<256U>.m_data._M_elems._0_4_ =
             *(undefined4 *)
              merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems;
        oldRoot.super_base_blob<256U>.m_data._M_elems._4_4_ =
             *(undefined4 *)
              (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems + 4);
        oldRoot.super_base_blob<256U>.m_data._M_elems._8_4_ =
             *(undefined4 *)
              (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems + 8);
        oldRoot.super_base_blob<256U>.m_data._M_elems._12_4_ =
             *(undefined4 *)
              (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems + 0xc);
        oldRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)
              (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems + 0x10);
        oldRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)
              (merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems + 0x18);
      }
      newMutated = false;
      BlockMerkleRoot(&newRoot,&block,&newMutated);
      local_5d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_5c8 = "";
      local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xe5;
      file_00.m_begin = (iterator)&local_5d0;
      msg_00.m_end = pvVar25;
      msg_00.m_begin = pvVar24;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_5e0,
                 msg_00);
      bVar7 = ::operator==(&oldRoot.super_base_blob<256U>,&newRoot.super_base_blob<256U>);
      h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_87c760;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbb3f50;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&oldBranch;
      local_5f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_5e8 = "";
      pvVar24 = &DAT_00000001;
      pvVar25 = (iterator)0x0;
      h.super_base_blob<256U>.m_data._M_elems[0] = bVar7;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_5f0,
                 0xe5);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_600 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_5f8 = "";
      local_610 = &boost::unit_test::basic_cstring<char_const>::null;
      local_608 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xe6;
      file_01.m_begin = (iterator)&local_600;
      msg_01.m_end = pvVar25;
      msg_01.m_begin = pvVar24;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_610,
                 msg_01);
      h.super_base_blob<256U>.m_data._M_elems[0] =
           ::operator==(&newRoot.super_base_blob<256U>,&unmutatedRoot.super_base_blob<256U>);
      h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_87c779;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbb3f69;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&oldBranch;
      local_620 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_618 = "";
      pvVar24 = &DAT_00000001;
      pvVar25 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_620,
                 0xe6);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_630 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_628 = "";
      local_640 = &boost::unit_test::basic_cstring<char_const>::null;
      local_638 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xe7;
      file_02.m_begin = (iterator)&local_630;
      msg_02.m_end = pvVar25;
      msg_02.m_begin = pvVar24;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_640,
                 msg_02);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bVar7 = ::operator==(&newRoot.super_base_blob<256U>,(base_blob<256U> *)&mtx);
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,(i != CHECK_PRED) != bVar7);
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_568._0_8_ = "(newRoot == uint256()) == (ntx == 0)";
      local_568._8_8_ = "";
      h.super_base_blob<256U>.m_data._M_elems._8_8_ =
           h.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      h.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
      h.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      h.super_base_blob<256U>.m_data._M_elems._24_8_ = local_568;
      local_650 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_648 = "";
      pvVar24 = &DAT_00000001;
      pvVar25 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&oldBranch,(lazy_ostream *)&h,1,0,WARN,_cVar33,
                 (size_t)&local_650,0xe7);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_660 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_658 = "";
      local_670 = &boost::unit_test::basic_cstring<char_const>::null;
      local_668 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xe8;
      file_03.m_begin = (iterator)&local_660;
      msg_03.m_end = pvVar25;
      msg_03.m_begin = pvVar24;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_670,
                 msg_03);
      h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_87c7ab;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbb3fa7;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&oldBranch;
      local_680 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_678 = "";
      pvVar24 = &DAT_00000001;
      pvVar25 = (iterator)0x0;
      h.super_base_blob<256U>.m_data._M_elems[0] = bVar31 == newMutated;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_680,
                 0xe8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_690 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_688 = "";
      local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_698 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xe9;
      file_04.m_begin = (iterator)&local_690;
      msg_04.m_end = pvVar25;
      msg_04.m_begin = pvVar24;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_6a0,
                 msg_04);
      h.super_base_blob<256U>.m_data._M_elems[0] = newMutated == (iVar8 != 0);
      h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_87c7b6;
      oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbb3fbe;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&oldBranch;
      local_6b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6a8 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_6b0,
                 0xe9);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
      if (iVar8 == 0) {
        for (cVar21 = CHECK_PRED; cVar21 != cVar9; cVar21 = cVar21 + CHECK_MSG) {
          _cVar33 = CONCAT44((int)((ulong)_cVar33 >> 0x20),cVar21);
          if (0x10 < (int)i) {
            cVar12 = RandomMixin<FastRandomContext>::randrange<int>
                               (&this_00->super_RandomMixin<FastRandomContext>,i);
            _cVar33 = CONCAT44((int)((ulong)_cVar33 >> 0x20),cVar12);
          }
          local_568._0_8_ = (pointer)0x0;
          local_568._8_8_ = (pointer)0x0;
          local_568._16_8_ = (pointer)0x0;
          std::vector<uint256,_std::allocator<uint256>_>::resize
                    ((vector<uint256,_std::allocator<uint256>_> *)local_568,
                     (long)block.vtx.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)block.vtx.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
          puVar30 = (pointer)local_568._8_8_;
          puVar18 = (pointer)local_568._0_8_;
          lVar16 = 0;
          for (uVar26 = 0;
              uVar26 < (ulong)((long)block.vtx.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)block.vtx.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
              uVar26 = uVar26 + 1) {
            lVar29 = *(long *)((long)&((block.vtx.
                                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar16);
            uVar4 = *(undefined8 *)(lVar29 + 0x39);
            uVar5 = *(undefined8 *)(lVar29 + 0x41);
            uVar6 = *(undefined8 *)(lVar29 + 0x51);
            puVar1 = (((base_blob<256U> *)local_568._0_8_)->m_data)._M_elems + lVar16 * 2 + 0x10;
            *(undefined8 *)puVar1 = *(undefined8 *)(lVar29 + 0x49);
            *(undefined8 *)(puVar1 + 8) = uVar6;
            puVar1 = (((base_blob<256U> *)local_568._0_8_)->m_data)._M_elems + lVar16 * 2;
            *(undefined8 *)puVar1 = uVar4;
            *(undefined8 *)(puVar1 + 8) = uVar5;
            lVar16 = lVar16 + 0x10;
          }
          newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (local_568._8_8_ != local_568._0_8_) {
            cVar12 = CHECK_PRED;
            memset(&mtx,0,0x400);
            uVar26 = 0xffffffff;
            while (uVar28 = (ulong)cVar12, uVar28 < (ulong)((long)puVar30 - (long)puVar18 >> 5)) {
              h.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   *(undefined8 *)puVar18[uVar28].super_base_blob<256U>.m_data._M_elems;
              h.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   *(undefined8 *)(puVar18[uVar28].super_base_blob<256U>.m_data._M_elems + 8);
              puVar1 = puVar18[uVar28].super_base_blob<256U>.m_data._M_elems + 0x10;
              h.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
              h.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
              bVar31 = cVar12 == (check_type)_cVar33;
              cVar12 = cVar12 + CHECK_MSG;
              a = &mtx;
              uVar28 = 0;
              while ((cVar12 >> ((uint)uVar28 & 0x1f) & 1) == 0) {
                __x = a;
                bVar7 = bVar31;
                if (bVar31) {
LAB_00384bef:
                  std::vector<uint256,_std::allocator<uint256>_>::push_back
                            (&newBranch,(value_type *)__x);
                  bVar31 = bVar7;
                }
                else {
                  __x = (CMutableTransaction *)&h;
                  bVar7 = true;
                  if (uVar26 == uVar28) goto LAB_00384bef;
                }
                ::operator==((base_blob<256U> *)a,&h.super_base_blob<256U>);
                Hash<uint256,uint256>((uint256 *)&oldBranch,(uint256 *)a,&h);
                h.super_base_blob<256U>.m_data._M_elems._16_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                h.super_base_blob<256U>.m_data._M_elems._24_8_ = uStack_460;
                h.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start;
                h.super_base_blob<256U>.m_data._M_elems._8_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                uVar28 = uVar28 + 1;
                a = (CMutableTransaction *)
                    &(a->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish;
              }
              lVar16 = (uVar28 & 0xffffffff) * 0x20;
              *(undefined8 *)((long)&mtx.vin + lVar16 + 0x10) =
                   h.super_base_blob<256U>.m_data._M_elems._16_8_;
              *(undefined8 *)((long)&mtx.vout + lVar16) =
                   h.super_base_blob<256U>.m_data._M_elems._24_8_;
              *(undefined8 *)((long)&mtx.vin + lVar16) =
                   h.super_base_blob<256U>.m_data._M_elems._0_8_;
              *(undefined8 *)((long)&mtx.vin + lVar16 + 8) =
                   h.super_base_blob<256U>.m_data._M_elems._8_8_;
              puVar18 = (pointer)local_568._0_8_;
              puVar30 = (pointer)local_568._8_8_;
              if (bVar31) {
                uVar26 = uVar28 & 0xffffffff;
              }
            }
            uVar19 = 0xffffffff;
            puVar20 = &h;
            do {
              puVar22 = puVar20;
              uVar19 = uVar19 + 1;
              puVar20 = puVar22 + 1;
            } while ((cVar12 >> (uVar19 & 0x1f) & 1) == 0);
            h.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)puVar22[1].super_base_blob<256U>.m_data._M_elems;
            h.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)(puVar22[1].super_base_blob<256U>.m_data._M_elems + 8);
            h.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)(puVar22[1].super_base_blob<256U>.m_data._M_elems + 0x10);
            h.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)(puVar22[1].super_base_blob<256U>.m_data._M_elems + 0x18);
            bVar31 = (uint)uVar26 == uVar19;
            while (cVar34 = 1 << ((byte)uVar19 & 0x1f), cVar12 != cVar34) {
              if (bVar31) {
                std::vector<uint256,_std::allocator<uint256>_>::push_back(&newBranch,&h);
              }
              Hash<uint256,uint256>((uint256 *)&oldBranch,&h,&h);
              cVar12 = cVar12 + cVar34;
              puVar20 = (uint256 *)((long)&mtx.vout + (long)(int)uVar19 * 0x20 + 8);
              while( true ) {
                h.super_base_blob<256U>.m_data._M_elems._24_8_ = uStack_460;
                uVar19 = uVar19 + 1;
                h.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start;
                h.super_base_blob<256U>.m_data._M_elems._8_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                h.super_base_blob<256U>.m_data._M_elems._16_8_ =
                     oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                if ((cVar12 >> (uVar19 & 0x1f) & 1) != 0) break;
                puVar22 = puVar20;
                bVar7 = bVar31;
                if (bVar31) {
LAB_00384d6e:
                  std::vector<uint256,_std::allocator<uint256>_>::push_back(&newBranch,puVar22);
                  bVar31 = bVar7;
                }
                else {
                  puVar22 = &h;
                  bVar7 = true;
                  if ((uint)uVar26 == uVar19) goto LAB_00384d6e;
                }
                Hash<uint256,uint256>((uint256 *)&oldBranch,puVar20,&h);
                puVar20 = puVar20 + 1;
              }
            }
          }
          std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                    ((_Vector_base<uint256,_std::allocator<uint256>_> *)local_568);
          oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar10 = 0;
          cVar12 = (check_type)_cVar33;
          uVar26 = (ulong)((long)block.vtx.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)block.vtx.
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4;
          while (iVar15 = (int)uVar26, 1 < iVar15) {
            cVar34 = cVar12 ^ CHECK_MSG;
            if ((int)(iVar15 - CHECK_MSG) < (int)(cVar12 ^ CHECK_MSG)) {
              cVar34 = iVar15 - CHECK_MSG;
            }
            std::vector<uint256,_std::allocator<uint256>_>::push_back
                      (&oldBranch,
                       merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)(cVar34 + iVar10));
            cVar12 = (int)cVar12 >> 1;
            iVar10 = iVar10 + iVar15;
            uVar26 = (ulong)(iVar15 + 1U >> 1);
          }
          local_6d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_6d0 = "";
          local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0xf4;
          file_05.m_begin = (iterator)&local_6d8;
          msg_05.m_end = in_R9;
          msg_05.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_6e8,msg_05);
          bVar31 = std::operator==(&oldBranch,&newBranch);
          h.super_base_blob<256U>.m_data._M_elems[0] = bVar31;
          h.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          h.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          local_568._0_8_ = "oldBranch == newBranch";
          local_568._8_8_ = "";
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                       _M_impl.super__Vector_impl_data._M_finish &
                               0xffffffffffffff00);
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_011481f0;
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_568;
          local_6f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_6f0 = "";
          pvVar24 = &DAT_00000001;
          pvVar25 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&h,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,(size_t)&local_6f8
                     ,0xf4);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)(h.super_base_blob<256U>.m_data._M_elems + 0x10));
          local_708 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_700 = "";
          local_728._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
          local_728._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0xf5;
          file_06.m_begin = (iterator)&local_708;
          msg_06.m_end = pvVar25;
          msg_06.m_begin = pvVar24;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)(local_728 + 0x10),msg_06);
          peVar3 = block.vtx.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)(check_type)_cVar33].
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          h.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          h.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          h.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          h.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          for (puVar18 = newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start;
              puVar18 !=
              newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
            if ((check_type)((ulong)_cVar33 & 1) == CHECK_PRED) {
              Hash<uint256,uint256>((uint256 *)&mtx,&h,puVar18);
            }
            else {
              Hash<uint256,uint256>((uint256 *)&mtx,puVar18,&h);
            }
            h.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            h.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
            h.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
            h.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            _cVar33 = CONCAT44((int)((ulong)_cVar33 >> 0x20),(check_type)_cVar33 >> 1);
          }
          bVar31 = ::operator==(&h.super_base_blob<256U>,&oldRoot.super_base_blob<256U>);
          local_568[0] = bVar31;
          local_568._8_8_ = (pointer)0x0;
          local_568._16_8_ = (pointer)0x0;
          local_728._0_8_ =
               "ComputeMerkleRootFromBranch(block.vtx[mtx]->GetHash(), newBranch, mtx) == oldRoot";
          local_728._8_8_ = "";
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                       _M_impl.super__Vector_impl_data._M_finish &
                               0xffffffffffffff00);
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_011481f0;
          mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_728;
          local_738 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_730 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_568,(lazy_ostream *)&mtx,1,0,WARN,_cVar33,
                     (size_t)&local_738,0xf5);
          boost::detail::shared_count::~shared_count((shared_count *)(local_568 + 0x10));
          std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                    (&oldBranch.super__Vector_base<uint256,_std::allocator<uint256>_>);
          std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                    (&newBranch.super__Vector_base<uint256,_std::allocator<uint256>_>);
        }
      }
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&merkleTree.super__Vector_base<uint256,_std::allocator<uint256>_>);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&block.vtx);
    }
    cVar13 = cVar13 + CHECK_MSG;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test)
{
    for (int i = 0; i < 32; i++) {
        // Try 32 block sizes: all sizes from 0 to 16 inclusive, and then 15 random sizes.
        int ntx = (i <= 16) ? i : 17 + (m_rng.randrange(4000));
        // Try up to 3 mutations.
        for (int mutate = 0; mutate <= 3; mutate++) {
            int duplicate1 = mutate >= 1 ? 1 << ctz(ntx) : 0; // The last how many transactions to duplicate first.
            if (duplicate1 >= ntx) break; // Duplication of the entire tree results in a different root (it adds a level).
            int ntx1 = ntx + duplicate1; // The resulting number of transactions after the first duplication.
            int duplicate2 = mutate >= 2 ? 1 << ctz(ntx1) : 0; // Likewise for the second mutation.
            if (duplicate2 >= ntx1) break;
            int ntx2 = ntx1 + duplicate2;
            int duplicate3 = mutate >= 3 ? 1 << ctz(ntx2) : 0; // And for the third mutation.
            if (duplicate3 >= ntx2) break;
            int ntx3 = ntx2 + duplicate3;
            // Build a block with ntx different transactions.
            CBlock block;
            block.vtx.resize(ntx);
            for (int j = 0; j < ntx; j++) {
                CMutableTransaction mtx;
                mtx.nLockTime = j;
                block.vtx[j] = MakeTransactionRef(std::move(mtx));
            }
            // Compute the root of the block before mutating it.
            bool unmutatedMutated = false;
            uint256 unmutatedRoot = BlockMerkleRoot(block, &unmutatedMutated);
            BOOST_CHECK(unmutatedMutated == false);
            // Optionally mutate by duplicating the last transactions, resulting in the same merkle root.
            block.vtx.resize(ntx3);
            for (int j = 0; j < duplicate1; j++) {
                block.vtx[ntx + j] = block.vtx[ntx + j - duplicate1];
            }
            for (int j = 0; j < duplicate2; j++) {
                block.vtx[ntx1 + j] = block.vtx[ntx1 + j - duplicate2];
            }
            for (int j = 0; j < duplicate3; j++) {
                block.vtx[ntx2 + j] = block.vtx[ntx2 + j - duplicate3];
            }
            // Compute the merkle root and merkle tree using the old mechanism.
            bool oldMutated = false;
            std::vector<uint256> merkleTree;
            uint256 oldRoot = BlockBuildMerkleTree(block, &oldMutated, merkleTree);
            // Compute the merkle root using the new mechanism.
            bool newMutated = false;
            uint256 newRoot = BlockMerkleRoot(block, &newMutated);
            BOOST_CHECK(oldRoot == newRoot);
            BOOST_CHECK(newRoot == unmutatedRoot);
            BOOST_CHECK((newRoot == uint256()) == (ntx == 0));
            BOOST_CHECK(oldMutated == newMutated);
            BOOST_CHECK(newMutated == !!mutate);
            // If no mutation was done (once for every ntx value), try up to 16 branches.
            if (mutate == 0) {
                for (int loop = 0; loop < std::min(ntx, 16); loop++) {
                    // If ntx <= 16, try all branches. Otherwise, try 16 random ones.
                    int mtx = loop;
                    if (ntx > 16) {
                        mtx = m_rng.randrange(ntx);
                    }
                    std::vector<uint256> newBranch = BlockMerkleBranch(block, mtx);
                    std::vector<uint256> oldBranch = BlockGetMerkleBranch(block, merkleTree, mtx);
                    BOOST_CHECK(oldBranch == newBranch);
                    BOOST_CHECK(ComputeMerkleRootFromBranch(block.vtx[mtx]->GetHash(), newBranch, mtx) == oldRoot);
                }
            }
        }
    }
}